

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O2

void pinger_read_cb(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  pinger_t *pinger;
  undefined1 auVar1 [16];
  uint uVar2;
  size_t sVar3;
  undefined8 uVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  int64_t eval_b;
  int64_t eval_a;
  
  if (nread < 0) {
    eval_b = -0xfff;
    if (nread == -0xfff) {
      puts("got EOF");
      free(buf->base);
      uv_close(stream,pinger_on_close);
      return;
    }
    pcVar6 = "UV_EOF";
    pcVar5 = "nread";
    uVar4 = 0x82;
    eval_a = nread;
LAB_0015e62e:
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,uVar4,pcVar5,"==",pcVar6,eval_a,"==",eval_b);
    abort();
  }
  pinger = (pinger_t *)stream->data;
  lVar7 = 0;
  do {
    if (nread == lVar7) {
LAB_0015e5e6:
      free(buf->base);
      return;
    }
    eval_a = (int64_t)buf->base[lVar7];
    uVar2 = pinger->state;
    eval_b = (int64_t)pinger->pong[uVar2];
    if (eval_a != eval_b) {
      pcVar6 = "pinger->pong[pinger->state]";
      pcVar5 = "buf->base[i]";
      uVar4 = 0x8e;
      goto LAB_0015e62e;
    }
    sVar3 = strlen(pinger->pong);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar3;
    auVar1 = ZEXT416(uVar2 + 1) % auVar1;
    pinger->state = auVar1._0_4_;
    if (auVar1._0_8_ == 0) {
      printf("PONG %d\n",(ulong)pinger->pongs);
      uVar2 = pinger->pongs + 1;
      pinger->pongs = uVar2;
      if (999 < uVar2) {
        uv_close(stream,pinger_on_close);
        goto LAB_0015e5e6;
      }
      pinger_write_ping(pinger);
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

static void pinger_read_cb(uv_stream_t* stream,
                           ssize_t nread,
                           const uv_buf_t* buf) {
  ssize_t i;
  pinger_t* pinger;

  pinger = (pinger_t*) stream->data;

  if (nread < 0) {
    ASSERT_EQ(nread, UV_EOF);

    puts("got EOF");
    free(buf->base);

    uv_close((uv_handle_t*) stream, pinger_on_close);

    return;
  }

  /* Now we count the pongs */
  for (i = 0; i < nread; i++) {
    ASSERT_EQ(buf->base[i], pinger->pong[pinger->state]);
    pinger->state = (pinger->state + 1) % strlen(pinger->pong);

    if (pinger->state != 0)
      continue;

    printf("PONG %d\n", pinger->pongs);
    pinger->pongs++;

    if (pinger->pongs < NUM_PINGS) {
      pinger_write_ping(pinger);
    } else {
      uv_close((uv_handle_t*) stream, pinger_on_close);
      break;
    }
  }

  free(buf->base);
}